

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

void tcg_dump_op_s390x(TCGContext_conflict12 *s,_Bool have_prefs,TCGOp *op)

{
  byte bVar1;
  byte bVar2;
  FILE *pFVar3;
  uint uVar4;
  TCGMemOpIdx oi_00;
  MemOp_conflict MVar5;
  uint uVar6;
  TCGOpDef *pTVar7;
  char *pcVar8;
  char *pcVar9;
  TCGLabel *pTVar10;
  TCGTemp *pTVar11;
  uint local_114;
  TCGRegSet set;
  uint life;
  TCGTemp *tp;
  char *s_op;
  char *s_al;
  uint ix;
  MemOp_conflict op_1;
  TCGMemOpIdx oi;
  char *t;
  TCGArg arg;
  target_ulong a;
  TCGOpcode c;
  TCGOpDef *def;
  int nb_cargs;
  int nb_iargs;
  int nb_oargs;
  int k;
  int i;
  char buf [128];
  TCGOp *op_local;
  _Bool have_prefs_local;
  TCGContext_conflict12 *s_local;
  
  pFVar3 = _stderr;
  uVar4 = *(uint *)op & 0xff;
  pTVar7 = s->tcg_op_defs + uVar4;
  if (uVar4 == 0x81) {
    nb_cargs = 0;
    fprintf(_stderr," ----");
    for (nb_oargs = 0; nb_oargs < 3; nb_oargs = nb_oargs + 1) {
      fprintf(_stderr," %016lx",op->args[nb_oargs]);
    }
    goto LAB_01213b35;
  }
  if (uVar4 == 2) {
    nb_cargs = *(uint *)op >> 0xc & 0xf;
    uVar4 = *(uint *)op >> 8 & 0xf;
    pcVar9 = pTVar7->name;
    pcVar8 = tcg_find_helper(s,op->args[(int)(nb_cargs + uVar4)]);
    fprintf(pFVar3," %s %s,$0x%lx,$%d",pcVar9,pcVar8,op->args[(int)(nb_cargs + uVar4 + 1)],
            (ulong)(uint)nb_cargs);
    for (nb_oargs = 0; pFVar3 = _stderr, nb_oargs < nb_cargs; nb_oargs = nb_oargs + 1) {
      pcVar9 = tcg_get_arg_str(s,(char *)&k,0x80,op->args[nb_oargs]);
      fprintf(pFVar3,",%s",pcVar9);
    }
    for (nb_oargs = 0; nb_oargs < (int)uVar4; nb_oargs = nb_oargs + 1) {
      _op_1 = "<dummy>";
      if (op->args[nb_cargs + nb_oargs] != 0) {
        _op_1 = tcg_get_arg_str(s,(char *)&k,0x80,op->args[nb_cargs + nb_oargs]);
      }
      fprintf(_stderr,",%s",_op_1);
    }
    goto LAB_01213b35;
  }
  fprintf(_stderr," %s ",pTVar7->name);
  nb_cargs = (int)pTVar7->nb_oargs;
  bVar1 = pTVar7->nb_iargs;
  bVar2 = pTVar7->nb_cargs;
  if ((pTVar7->flags & 0x40) != 0) {
    fprintf(_stderr,"v%d,e%d,",(ulong)(uint)(0x40 << ((byte)((uint)*(undefined4 *)op >> 8) & 0xf)),
            (ulong)(uint)(8 << ((byte)(*(uint *)op >> 0xc) & 0xf)));
  }
  nb_iargs = 0;
  for (nb_oargs = 0; nb_oargs < nb_cargs; nb_oargs = nb_oargs + 1) {
    if (nb_iargs != 0) {
      fprintf(_stderr,",");
    }
    pFVar3 = _stderr;
    pcVar9 = tcg_get_arg_str(s,(char *)&k,0x80,op->args[nb_iargs]);
    fprintf(pFVar3,"%s",pcVar9);
    nb_iargs = nb_iargs + 1;
  }
  for (nb_oargs = 0; nb_oargs < (int)(uint)bVar1; nb_oargs = nb_oargs + 1) {
    if (nb_iargs != 0) {
      fprintf(_stderr,",");
    }
    pFVar3 = _stderr;
    pcVar9 = tcg_get_arg_str(s,(char *)&k,0x80,op->args[nb_iargs]);
    fprintf(pFVar3,"%s",pcVar9);
    nb_iargs = nb_iargs + 1;
  }
  if ((((uVar4 - 7 < 2) || (uVar4 == 0x26)) || (uVar4 - 0x2d < 2)) ||
     ((uVar4 - 0x41 < 2 || (uVar4 == 0x67)))) {
LAB_012137c9:
    if ((op->args[nb_iargs] < 0xe) && (cond_name[op->args[nb_iargs]] != (char *)0x0)) {
      fprintf(_stderr,",%s",cond_name[op->args[nb_iargs]]);
    }
    else {
      fprintf(_stderr,",$0x%lx",op->args[nb_iargs]);
    }
    nb_iargs = nb_iargs + 1;
    nb_oargs = 1;
  }
  else if (uVar4 - 0x85 < 4) {
    oi_00 = (TCGMemOpIdx)op->args[nb_iargs];
    MVar5 = get_memop(oi_00);
    uVar6 = get_mmuidx(oi_00);
    if ((MVar5 & ~(MO_ALIGN|MO_BESL|MO_16)) == MO_8) {
      fprintf(_stderr,",%s%s,%u",alignment_name[(MVar5 & MO_ALIGN) >> 4],
              ldst_name[MVar5 & (MO_BESL|MO_16)],(ulong)uVar6);
    }
    else {
      fprintf(_stderr,",$0x%x,%u",(ulong)MVar5,(ulong)uVar6);
    }
    nb_oargs = 1;
    nb_iargs = nb_iargs + 1;
  }
  else {
    if ((uVar4 == 0xac) || (uVar4 == 0xae)) goto LAB_012137c9;
    nb_oargs = 0;
  }
  pFVar3 = _stderr;
  if ((((uVar4 == 1) || (uVar4 == 3)) || (uVar4 == 0x26)) || ((uVar4 == 0x2d || (uVar4 == 0x67)))) {
    pcVar9 = "";
    if (nb_iargs != 0) {
      pcVar9 = ",";
    }
    pTVar10 = arg_label(op->args[nb_iargs]);
    fprintf(pFVar3,"%s$L%d",pcVar9,(ulong)(*(uint *)pTVar10 >> 2 & 0x3fff));
    nb_oargs = nb_oargs + 1;
    nb_iargs = nb_iargs + 1;
  }
  for (; nb_oargs < (int)(uint)bVar2; nb_oargs = nb_oargs + 1) {
    pcVar9 = "";
    if (nb_iargs != 0) {
      pcVar9 = ",";
    }
    fprintf(_stderr,"%s$0x%lx",pcVar9,op->args[nb_iargs]);
    nb_iargs = nb_iargs + 1;
  }
  if (((uVar4 == 0x3f) && (pTVar11 = arg_temp(op->args[1]), pTVar11 != (TCGTemp *)0x0)) &&
     (((uint)((ulong)*(undefined8 *)pTVar11 >> 8) & 0xff) == 2)) {
    fprintf(_stderr," mem_base=%p ",pTVar11->mem_base);
  }
LAB_01213b35:
  if (*(uint *)op >> 0x10 != 0) {
    local_114 = *(uint *)op;
    uVar4 = local_114 >> 0x10;
    if ((uVar4 & 3) != 0) {
      fprintf(_stderr,"  sync:");
      for (nb_oargs = 0; nb_oargs < 2; nb_oargs = nb_oargs + 1) {
        if ((uVar4 & 1 << ((byte)nb_oargs & 0x1f)) != 0) {
          fprintf(_stderr," %d",(ulong)(uint)nb_oargs);
        }
      }
    }
    local_114 = local_114 >> 0x12;
    if (local_114 != 0) {
      fprintf(_stderr,"  dead:");
      nb_oargs = 0;
      for (; local_114 != 0; local_114 = local_114 >> 1) {
        if ((local_114 & 1) != 0) {
          fprintf(_stderr," %d",(ulong)(uint)nb_oargs);
        }
        nb_oargs = nb_oargs + 1;
      }
    }
  }
  if (have_prefs) {
    for (nb_oargs = 0; nb_oargs < nb_cargs; nb_oargs = nb_oargs + 1) {
      uVar4 = op->output_pref[nb_oargs];
      if (nb_oargs == 0) {
        fprintf(_stderr,"  pref=");
      }
      else {
        fprintf(_stderr,",");
      }
      if (uVar4 == 0) {
        fprintf(_stderr,"none");
      }
      else if (uVar4 == 0xffffffff) {
        fprintf(_stderr,"all");
      }
      else {
        fprintf(_stderr,"%#x",(ulong)uVar4);
      }
    }
  }
  fprintf(_stderr,"\n");
  return;
}

Assistant:

void tcg_dump_op(TCGContext *s, bool have_prefs, TCGOp* op)
{
    char buf[128];
    int i, k, nb_oargs, nb_iargs, nb_cargs;
    const TCGOpDef *def;
    TCGOpcode c;

    c = op->opc;
    def = &s->tcg_op_defs[c];
    if (c == INDEX_op_insn_start) {
        nb_oargs = 0;
        fprintf(stderr, " ----");

        for (i = 0; i < TARGET_INSN_START_WORDS; ++i) {
            target_ulong a;
#if TARGET_LONG_BITS > TCG_TARGET_REG_BITS
            a = deposit64(op->args[i * 2], 32, 32, op->args[i * 2 + 1]);
#else
            a = op->args[i];
#endif
            fprintf(stderr, " " TARGET_FMT_lx, a);
        }
    } else if (c == INDEX_op_call) {
        /* variable number of arguments */
        nb_oargs = TCGOP_CALLO(op);
        nb_iargs = TCGOP_CALLI(op);
        nb_cargs = def->nb_cargs;

        /* function name, flags, out args */
        fprintf(stderr, " %s %s,$0x%" TCG_PRIlx ",$%d", def->name,
                      tcg_find_helper(s, op->args[nb_oargs + nb_iargs]),
                      op->args[nb_oargs + nb_iargs + 1], nb_oargs);
        for (i = 0; i < nb_oargs; i++) {
            fprintf(stderr, ",%s", tcg_get_arg_str(s, buf, sizeof(buf),
                                                 op->args[i]));
        }
        for (i = 0; i < nb_iargs; i++) {
            TCGArg arg = op->args[nb_oargs + i];
            const char *t = "<dummy>";
            if (arg != TCG_CALL_DUMMY_ARG) {
                t = tcg_get_arg_str(s, buf, sizeof(buf), arg);
            }
            fprintf(stderr, ",%s", t);
        }
    } else {
        fprintf(stderr, " %s ", def->name);

        nb_oargs = def->nb_oargs;
        nb_iargs = def->nb_iargs;
        nb_cargs = def->nb_cargs;

        if (def->flags & TCG_OPF_VECTOR) {
            fprintf(stderr, "v%d,e%d,", 64 << TCGOP_VECL(op),
                          8 << TCGOP_VECE(op));
        }

        k = 0;
        for (i = 0; i < nb_oargs; i++) {
            if (k != 0) {
                fprintf(stderr, ",");
            }
            fprintf(stderr, "%s", tcg_get_arg_str(s, buf, sizeof(buf),
                                                op->args[k++]));
        }
        for (i = 0; i < nb_iargs; i++) {
            if (k != 0) {
                fprintf(stderr, ",");
            }
            fprintf(stderr, "%s", tcg_get_arg_str(s, buf, sizeof(buf),
                                                op->args[k++]));
        }
        switch (c) {
            case INDEX_op_brcond_i32:
            case INDEX_op_setcond_i32:
            case INDEX_op_movcond_i32:
            case INDEX_op_brcond2_i32:
            case INDEX_op_setcond2_i32:
            case INDEX_op_brcond_i64:
            case INDEX_op_setcond_i64:
            case INDEX_op_movcond_i64:
            case INDEX_op_cmp_vec:
            case INDEX_op_cmpsel_vec:
                if (op->args[k] < ARRAY_SIZE(cond_name)
                    && cond_name[op->args[k]]) {
                    fprintf(stderr, ",%s", cond_name[op->args[k++]]);
                } else {
                    fprintf(stderr, ",$0x%" TCG_PRIlx, op->args[k++]);
                }
                i = 1;
                break;
            case INDEX_op_qemu_ld_i32:
            case INDEX_op_qemu_st_i32:
            case INDEX_op_qemu_ld_i64:
            case INDEX_op_qemu_st_i64:
            {
                TCGMemOpIdx oi = op->args[k++];
                MemOp op = get_memop(oi);
                unsigned ix = get_mmuidx(oi);

                if (op & ~(MO_AMASK | MO_BSWAP | MO_SSIZE)) {
                    fprintf(stderr, ",$0x%x,%u", op, ix);
                } else {
                    const char *s_al, *s_op;
                    s_al = alignment_name[(op & MO_AMASK) >> MO_ASHIFT];
                    s_op = ldst_name[op & (MO_BSWAP | MO_SSIZE)];
                    fprintf(stderr, ",%s%s,%u", s_al, s_op, ix);
                }
                i = 1;
            }
                break;
            default:
                i = 0;
                break;
        }
        switch (c) {
            case INDEX_op_set_label:
            case INDEX_op_br:
            case INDEX_op_brcond_i32:
            case INDEX_op_brcond_i64:
            case INDEX_op_brcond2_i32:
                fprintf(stderr, "%s$L%d", k ? "," : "",
                              arg_label(op->args[k])->id);
                i++, k++;
                break;
            default:
                break;
        }
        for (; i < nb_cargs; i++, k++) {
            fprintf(stderr, "%s$0x%" TCG_PRIlx, k ? "," : "", op->args[k]);
        }
        if(c == INDEX_op_mov_i64){
            struct TCGTemp* tp = arg_temp(op->args[1]);
            if (tp && tp->val_type == TEMP_VAL_MEM){
                fprintf(stderr, " mem_base=%p ", tp->mem_base);
            }
        }
    }

    if (op->life) {
        unsigned life = op->life;

        if (life & (SYNC_ARG * 3)) {
            fprintf(stderr, "  sync:");
            for (i = 0; i < 2; ++i) {
                if (life & (SYNC_ARG << i)) {
                    fprintf(stderr, " %d", i);
                }
            }
        }
        life /= DEAD_ARG;
        if (life) {
            fprintf(stderr, "  dead:");
            for (i = 0; life; ++i, life >>= 1) {
                if (life & 1) {
                    fprintf(stderr, " %d", i);
                }
            }
        }
    }

    if (have_prefs) {
        for (i = 0; i < nb_oargs; ++i) {
            TCGRegSet set = op->output_pref[i];

            if (i == 0) {
                fprintf(stderr, "  pref=");
            } else {
                fprintf(stderr, ",");
            }
            if (set == 0) {
                fprintf(stderr, "none");
            } else if (set == MAKE_64BIT_MASK(0, TCG_TARGET_NB_REGS)) {
                fprintf(stderr, "all");
#ifdef CONFIG_DEBUG_TCG
                } else if (tcg_regset_single(set)) {
                    TCGReg reg = tcg_regset_first(set);
                    fprintf(stderr, "%s", tcg_target_reg_names[reg]);
#endif
            } else if (TCG_TARGET_NB_REGS <= 32) {
                fprintf(stderr, "%#x", (uint32_t)set);
            } else {
                fprintf(stderr, "%#" PRIx64, (uint64_t)set);
            }
        }
    }

    fprintf(stderr, "\n");
}